

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModelTests.cpp
# Opt level: O0

int testLinearModelBasic(void)

{
  bool bVar1;
  ostream *poVar2;
  FeatureType local_210;
  allocator local_1f9;
  undefined1 local_1f8 [72];
  FeatureType local_1b0;
  allocator local_199;
  undefined1 local_198 [72];
  FeatureType local_150;
  allocator local_139;
  undefined1 local_138 [76];
  undefined4 local_ec;
  FeatureType local_e8;
  allocator local_d1;
  undefined1 local_d0 [79];
  allocator local_81;
  string local_80;
  allocator local_49;
  undefined1 local_48 [40];
  LinearModel lr;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,"foo",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_80,"Linear regression model to predict Foo",&local_81);
  CoreML::LinearModel::LinearModel((LinearModel *)(local_48 + 0x20),(string *)local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string((string *)local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_d0,"x",&local_d1);
  CoreML::FeatureType::Int64();
  CoreML::Model::addInput
            ((Result *)(local_d0 + 0x20),(Model *)(local_48 + 0x20),(string *)local_d0,&local_e8);
  bVar1 = CoreML::Result::good((Result *)(local_d0 + 0x20));
  CoreML::Result::~Result((Result *)(local_d0 + 0x20));
  CoreML::FeatureType::~FeatureType(&local_e8);
  std::__cxx11::string::~string((string *)local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_138,"y",&local_139);
    CoreML::FeatureType::Double();
    CoreML::Model::addInput
              ((Result *)(local_138 + 0x20),(Model *)(local_48 + 0x20),(string *)local_138,
               &local_150);
    bVar1 = CoreML::Result::good((Result *)(local_138 + 0x20));
    CoreML::Result::~Result((Result *)(local_138 + 0x20));
    CoreML::FeatureType::~FeatureType(&local_150);
    std::__cxx11::string::~string((string *)local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_198,"z",&local_199);
      CoreML::FeatureType::Int64();
      CoreML::Model::addInput
                ((Result *)(local_198 + 0x20),(Model *)(local_48 + 0x20),(string *)local_198,
                 &local_1b0);
      bVar1 = CoreML::Result::good((Result *)(local_198 + 0x20));
      CoreML::Result::~Result((Result *)(local_198 + 0x20));
      CoreML::FeatureType::~FeatureType(&local_1b0);
      std::__cxx11::string::~string((string *)local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_1f8,"foo",&local_1f9);
        CoreML::FeatureType::Double();
        CoreML::Model::addOutput
                  ((Result *)(local_1f8 + 0x20),(Model *)(local_48 + 0x20),(string *)local_1f8,
                   &local_210);
        bVar1 = CoreML::Result::good((Result *)(local_1f8 + 0x20));
        CoreML::Result::~Result((Result *)(local_1f8 + 0x20));
        CoreML::FeatureType::~FeatureType(&local_210);
        std::__cxx11::string::~string((string *)local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          lr.super_Model.m_spec.
          super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._4_4_ = 0;
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/LinearModelTests.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x14);
          poVar2 = std::operator<<(poVar2,": error: ");
          poVar2 = std::operator<<(poVar2,"(lr.addOutput(\"foo\", FeatureType::Double())).good()");
          poVar2 = std::operator<<(poVar2," was false, expected true.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          lr.super_Model.m_spec.
          super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._4_4_ = 1;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/LinearModelTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x13);
        poVar2 = std::operator<<(poVar2,": error: ");
        poVar2 = std::operator<<(poVar2,"(lr.addInput(\"z\", FeatureType::Int64())).good()");
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        lr.super_Model.m_spec.
        super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = 1;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/LinearModelTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x12);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"(lr.addInput(\"y\", FeatureType::Double())).good()");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      lr.super_Model.m_spec.
      super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ._4_4_ = 1;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/LinearModelTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x11);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"(lr.addInput(\"x\", FeatureType::Int64())).good()");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    lr.super_Model.m_spec.
    super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
  }
  local_ec = 1;
  CoreML::LinearModel::~LinearModel((LinearModel *)(local_48 + 0x20));
  return lr.super_Model.m_spec.
         super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi._4_4_;
}

Assistant:

int testLinearModelBasic() {
    LinearModel lr("foo", "Linear regression model to predict Foo");
    ML_ASSERT_GOOD(lr.addInput("x", FeatureType::Int64()));
    ML_ASSERT_GOOD(lr.addInput("y", FeatureType::Double()));
    ML_ASSERT_GOOD(lr.addInput("z", FeatureType::Int64()));
    ML_ASSERT_GOOD(lr.addOutput("foo", FeatureType::Double()));
    return 0;
}